

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error FT_Face_Properties(FT_Face face,FT_UInt num_properties,FT_Parameter *properties)

{
  FT_ULong FVar1;
  FT_Error FVar2;
  int iVar3;
  FT_Pointer *ppvVar4;
  
  FVar2 = 6;
  if (num_properties == 0 || properties != (FT_Parameter *)0x0) {
    if (num_properties != 0) {
      ppvVar4 = &properties->data;
      do {
        FVar1 = ((FT_Parameter *)(ppvVar4 + -1))->tag;
        if (FVar1 == 0x6461726b) {
          if ((char *)*ppvVar4 == (char *)0x0) {
            face->internal->no_stem_darkening = -1;
          }
          else if (**ppvVar4 == '\x01') {
            face->internal->no_stem_darkening = '\0';
          }
          else {
            face->internal->no_stem_darkening = '\x01';
          }
        }
        else {
          if (FVar1 != 0x73656564) {
            if (FVar1 == 0x6c636466) {
              return 7;
            }
            return 6;
          }
          if ((int *)*ppvVar4 == (int *)0x0) {
            face->internal->random_seed = -1;
          }
          else {
            iVar3 = **ppvVar4;
            if (iVar3 < 1) {
              iVar3 = 0;
            }
            face->internal->random_seed = iVar3;
          }
        }
        ppvVar4 = ppvVar4 + 2;
        num_properties = num_properties - 1;
      } while (num_properties != 0);
    }
    FVar2 = 0;
  }
  return FVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Face_Properties( FT_Face        face,
                      FT_UInt        num_properties,
                      FT_Parameter*  properties )
  {
    FT_Error  error = FT_Err_Ok;


    if ( num_properties > 0 && !properties )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    for ( ; num_properties > 0; num_properties-- )
    {
      if ( properties->tag == FT_PARAM_TAG_STEM_DARKENING )
      {
        if ( properties->data )
        {
          if ( *( (FT_Bool*)properties->data ) == TRUE )
            face->internal->no_stem_darkening = FALSE;
          else
            face->internal->no_stem_darkening = TRUE;
        }
        else
        {
          /* use module default */
          face->internal->no_stem_darkening = -1;
        }
      }
      else if ( properties->tag == FT_PARAM_TAG_LCD_FILTER_WEIGHTS )
      {
#ifdef FT_CONFIG_OPTION_SUBPIXEL_RENDERING
        if ( properties->data )
        {
          ft_memcpy( face->internal->lcd_weights,
                     properties->data,
                     FT_LCD_FILTER_FIVE_TAPS );
          face->internal->lcd_filter_func = ft_lcd_filter_fir;
        }
#else
        error = FT_THROW( Unimplemented_Feature );
        goto Exit;
#endif
      }
      else if ( properties->tag == FT_PARAM_TAG_RANDOM_SEED )
      {
        if ( properties->data )
        {
          face->internal->random_seed = *( (FT_Int32*)properties->data );
          if ( face->internal->random_seed < 0 )
            face->internal->random_seed = 0;
        }
        else
        {
          /* use module default */
          face->internal->random_seed = -1;
        }
      }
      else
      {
        error = FT_THROW( Invalid_Argument );
        goto Exit;
      }

      if ( error )
        break;

      properties++;
    }

  Exit:
    return error;
  }